

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O0

void google::protobuf::MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMap>(TestMap *message)

{
  bool bVar1;
  UntypedMapBase *pUVar2;
  char *pcVar3;
  Map<int,_int> *pMVar4;
  int *piVar5;
  Map<long,_long> *pMVar6;
  long *plVar7;
  Map<unsigned_int,_unsigned_int> *pMVar8;
  uint *puVar9;
  Map<unsigned_long,_unsigned_long> *pMVar10;
  unsigned_long *puVar11;
  Map<int,_float> *pMVar12;
  float *pfVar13;
  Map<int,_double> *pMVar14;
  double *pdVar15;
  Map<bool,_bool> *pMVar16;
  bool *pbVar17;
  Map<std::__cxx11::string,std::__cxx11::string> *pMVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar20;
  Map<int,_proto2_unittest::MapEnum> *pMVar21;
  MapEnum *pMVar22;
  Map<int,_proto2_unittest::ForeignMessage> *pMVar23;
  ForeignMessage *pFVar24;
  void *extraout_RDX;
  void *extraout_RDX_00;
  key_arg<int> *pkVar25;
  AssertHelper local_9b8;
  Message local_9b0;
  key_arg<int> local_9a4;
  int local_9a0 [2];
  undefined1 local_998 [8];
  AssertionResult gtest_ar_50;
  Message local_980;
  key_arg<int> local_978;
  MapEnum local_974;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_49;
  Message local_958;
  key_arg<int> local_94c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_48;
  Message local_910;
  key_arg<std::__cxx11::basic_string<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_47;
  Message local_8b0;
  key_arg<bool> local_8a2;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_46;
  Message local_888;
  key_arg<int> local_880;
  int local_87c;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_45;
  Message local_860;
  key_arg<int> local_858;
  int local_854;
  undefined1 local_850 [8];
  AssertionResult gtest_ar_44;
  Message local_838;
  key_arg<long> local_830;
  int local_824;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_43;
  Message local_808;
  key_arg<int> local_800;
  int local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_42;
  Message local_7e0;
  key_arg<unsigned_long> local_7d8;
  int local_7cc;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_41;
  Message local_7b0;
  key_arg<unsigned_int> local_7a8 [2];
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_40;
  Message local_788;
  key_arg<long> local_780;
  int local_774;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_39;
  Message local_758;
  key_arg<int> local_750;
  int local_74c;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_38;
  Message local_730;
  key_arg<unsigned_long> local_728;
  int local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_37;
  Message local_700;
  key_arg<unsigned_int> local_6f8 [2];
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_36;
  Message local_6d8;
  key_arg<long> local_6d0;
  int local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_35;
  Message local_6a8;
  key_arg<int> local_6a0;
  int local_69c;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_34;
  Message local_680;
  key_arg<int> local_674;
  int local_670 [2];
  undefined1 local_668 [8];
  AssertionResult gtest_ar_33;
  Message local_650;
  key_arg<int> local_648;
  MapEnum local_644;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_32;
  Message local_628;
  key_arg<int> local_61c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_31;
  Message local_5e0;
  key_arg<std::__cxx11::basic_string<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_30;
  Message local_580;
  key_arg<bool> local_572;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_29;
  Message local_558;
  key_arg<int> local_550;
  int local_54c;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_28;
  Message local_530;
  key_arg<int> local_528;
  int local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_27;
  Message local_508;
  key_arg<long> local_500;
  int local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_26;
  Message local_4d8;
  key_arg<int> local_4d0;
  int local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_25;
  Message local_4b0;
  key_arg<unsigned_long> local_4a8;
  int local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_24;
  Message local_480;
  key_arg<unsigned_int> local_478 [2];
  undefined1 local_470 [8];
  AssertionResult gtest_ar_23;
  Message local_458;
  key_arg<long> local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_22;
  Message local_428;
  key_arg<int> local_420;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_21;
  Message local_400;
  key_arg<unsigned_long> local_3f8;
  int local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_20;
  Message local_3d0;
  key_arg<unsigned_int> local_3c8 [2];
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_19;
  Message local_3a8;
  key_arg<long> local_3a0;
  int local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_18;
  Message local_378;
  key_arg<int> local_370;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_17;
  Message local_350;
  size_type local_348;
  int local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_16;
  Message local_320;
  size_type local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_15;
  Message local_2f0;
  size_type local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_14;
  Message local_2c0;
  size_type local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_13;
  Message local_290;
  size_type local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_12;
  Message local_260;
  size_type local_258;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  size_type local_228;
  int local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_10;
  Message local_200;
  size_type local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_9;
  Message local_1d0;
  size_type local_1c8;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_8;
  Message local_1a0;
  size_type local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_7;
  Message local_170;
  size_type local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_6;
  Message local_140;
  size_type local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  Message local_110;
  size_type local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  size_type local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  size_type local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  size_type local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50 [3];
  Message local_38;
  size_type local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TestMap *message_local;
  
  local_24 = 2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )message;
  pUVar2 = (UntypedMapBase *)proto2_unittest::TestMap::map_int32_int32(message);
  local_30 = internal::UntypedMapBase::size(pUVar2);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_20,"2","message.map_int32_int32().size()",&local_24,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x107,pcVar3);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::Message::~Message(&local_38);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_6c = 2;
    pUVar2 = (UntypedMapBase *)
             proto2_unittest::TestMap::map_int64_int64
                       ((TestMap *)
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    local_78 = internal::UntypedMapBase::size(pUVar2);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_68,"2","message.map_int64_int64().size()",&local_6c,&local_78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                 ,0x108,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_9c = 2;
      pUVar2 = (UntypedMapBase *)
               proto2_unittest::TestMap::map_uint32_uint32
                         ((TestMap *)
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      local_a8 = internal::UntypedMapBase::size(pUVar2);
      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                ((EqHelper *)local_98,"2","message.map_uint32_uint32().size()",&local_9c,&local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                   ,0x109,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_b0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_cc = 2;
        pUVar2 = (UntypedMapBase *)
                 proto2_unittest::TestMap::map_uint64_uint64
                           ((TestMap *)
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
        local_d8 = internal::UntypedMapBase::size(pUVar2);
        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_c8,"2","message.map_uint64_uint64().size()",&local_cc,&local_d8
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
        if (!bVar1) {
          testing::Message::Message(&local_e0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                     ,0x10a,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_e0);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_fc = 2;
          pUVar2 = (UntypedMapBase *)
                   proto2_unittest::TestMap::map_sint32_sint32
                             ((TestMap *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
          local_108 = internal::UntypedMapBase::size(pUVar2);
          testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_f8,"2","message.map_sint32_sint32().size()",&local_fc,
                     &local_108);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
          if (!bVar1) {
            testing::Message::Message(&local_110);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                       ,0x10b,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_110);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_110);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_12c = 2;
            pUVar2 = (UntypedMapBase *)
                     proto2_unittest::TestMap::map_sint64_sint64
                               ((TestMap *)
                                gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
            local_138 = internal::UntypedMapBase::size(pUVar2);
            testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                      ((EqHelper *)local_128,"2","message.map_sint64_sint64().size()",&local_12c,
                       &local_138);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
            if (!bVar1) {
              testing::Message::Message(&local_140);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                         ,0x10c,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_140);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_140);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_15c = 2;
              pUVar2 = (UntypedMapBase *)
                       proto2_unittest::TestMap::map_fixed32_fixed32
                                 ((TestMap *)
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
              local_168 = internal::UntypedMapBase::size(pUVar2);
              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_158,"2","message.map_fixed32_fixed32().size()",&local_15c
                         ,&local_168);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
              if (!bVar1) {
                testing::Message::Message(&local_170);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                           ,0x10d,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_170);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_170);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_18c = 2;
                pUVar2 = (UntypedMapBase *)
                         proto2_unittest::TestMap::map_fixed64_fixed64
                                   ((TestMap *)
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
                local_198 = internal::UntypedMapBase::size(pUVar2);
                testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_188,"2","message.map_fixed64_fixed64().size()",
                           &local_18c,&local_198);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_188);
                if (!bVar1) {
                  testing::Message::Message(&local_1a0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                             ,0x10e,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_1a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_1a0);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_1bc = 2;
                  pUVar2 = (UntypedMapBase *)
                           proto2_unittest::TestMap::map_sfixed32_sfixed32
                                     ((TestMap *)
                                      gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
                  local_1c8 = internal::UntypedMapBase::size(pUVar2);
                  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                            ((EqHelper *)local_1b8,"2","message.map_sfixed32_sfixed32().size()",
                             &local_1bc,&local_1c8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_1b8);
                  if (!bVar1) {
                    testing::Message::Message(&local_1d0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                               ,0x10f,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_1d0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_1d0);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_1ec = 2;
                    pUVar2 = (UntypedMapBase *)
                             proto2_unittest::TestMap::map_sfixed64_sfixed64
                                       ((TestMap *)
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
                    local_1f8 = internal::UntypedMapBase::size(pUVar2);
                    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                              ((EqHelper *)local_1e8,"2","message.map_sfixed64_sfixed64().size()",
                               &local_1ec,&local_1f8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_200);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1e8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                 ,0x110,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_200);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_200);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_21c = 2;
                      pUVar2 = (UntypedMapBase *)
                               proto2_unittest::TestMap::map_int32_float
                                         ((TestMap *)
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
                      local_228 = internal::UntypedMapBase::size(pUVar2);
                      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                ((EqHelper *)local_218,"2","message.map_int32_float().size()",
                                 &local_21c,&local_228);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_218);
                      if (!bVar1) {
                        testing::Message::Message(&local_230);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_218);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                   ,0x111,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_230);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_230);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_24c = 2;
                        pUVar2 = (UntypedMapBase *)
                                 proto2_unittest::TestMap::map_int32_double
                                           ((TestMap *)
                                            gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                        local_258 = internal::UntypedMapBase::size(pUVar2);
                        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                  ((EqHelper *)local_248,"2","message.map_int32_double().size()",
                                   &local_24c,&local_258);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_248);
                        if (!bVar1) {
                          testing::Message::Message(&local_260);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_248);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                     ,0x112,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_260);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_260);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_27c = 2;
                          pUVar2 = (UntypedMapBase *)
                                   proto2_unittest::TestMap::map_bool_bool
                                             ((TestMap *)
                                              gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl);
                          local_288 = internal::UntypedMapBase::size(pUVar2);
                          testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                    ((EqHelper *)local_278,"2","message.map_bool_bool().size()",
                                     &local_27c,&local_288);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_278);
                          if (!bVar1) {
                            testing::Message::Message(&local_290);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_278);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                       ,0x113,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_290);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_290);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_2ac = 2;
                            pUVar2 = (UntypedMapBase *)
                                     proto2_unittest::TestMap::map_string_string_abi_cxx11_
                                               ((TestMap *)
                                                gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl);
                            local_2b8 = internal::UntypedMapBase::size(pUVar2);
                            testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                      ((EqHelper *)local_2a8,"2",
                                       "message.map_string_string().size()",&local_2ac,&local_2b8);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_2a8);
                            if (!bVar1) {
                              testing::Message::Message(&local_2c0);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_2a8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                         ,0x114,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_2c0);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_2c0);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_2dc = 2;
                              pUVar2 = (UntypedMapBase *)
                                       proto2_unittest::TestMap::map_int32_bytes_abi_cxx11_
                                                 ((TestMap *)
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                              local_2e8 = internal::UntypedMapBase::size(pUVar2);
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_2d8,"2",
                                         "message.map_int32_bytes().size()",&local_2dc,&local_2e8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2d8);
                              if (!bVar1) {
                                testing::Message::Message(&local_2f0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2d8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                           ,0x115,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_2f0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_2f0);
                              }
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2d8);
                              if (gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_30c = 2;
                                pUVar2 = (UntypedMapBase *)
                                         proto2_unittest::TestMap::map_int32_enum
                                                   ((TestMap *)
                                                    gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                local_318 = internal::UntypedMapBase::size(pUVar2);
                                testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                          ((EqHelper *)local_308,"2",
                                           "message.map_int32_enum().size()",&local_30c,&local_318);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_308);
                                if (!bVar1) {
                                  testing::Message::Message(&local_320);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_308);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                             ,0x116,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_16.message_,&local_320);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_);
                                  testing::Message::~Message(&local_320);
                                }
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_308);
                                if (gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  local_33c = 2;
                                  pUVar2 = (UntypedMapBase *)
                                           proto2_unittest::TestMap::map_int32_foreign_message
                                                     ((TestMap *)
                                                      gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                  local_348 = internal::UntypedMapBase::size(pUVar2);
                                  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                            ((EqHelper *)local_338,"2",
                                             "message.map_int32_foreign_message().size()",&local_33c
                                             ,&local_348);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_338);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_350);
                                    pcVar3 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_338);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                               ,0x117,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,&local_350);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(&local_350);
                                  }
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_338);
                                  if (gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    local_36c = 0;
                                    pMVar4 = proto2_unittest::TestMap::map_int32_int32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_370 = 0;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_370);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_368,"0",
                                               "message.map_int32_int32().at(0)",&local_36c,piVar5);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_368);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_378);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_368);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x119,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,&local_378);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(&local_378);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_368);
                                    local_394 = 0;
                                    pMVar6 = proto2_unittest::TestMap::map_int64_int64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_3a0 = 0;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_3a0);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_390,"0",
                                               "message.map_int64_int64().at(0)",&local_394,plVar7);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_390);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_3a8);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_390);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_19.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11a,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_19.message_,&local_3a8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_19.message_);
                                      testing::Message::~Message(&local_3a8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_390);
                                    local_3c8[1] = 0;
                                    pMVar8 = proto2_unittest::TestMap::map_uint32_uint32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_3c8[0] = 0;
                                    puVar9 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (pMVar8,local_3c8);
                                    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                              ((EqHelper *)local_3c0,"0",
                                               "message.map_uint32_uint32().at(0)",
                                               (int *)(local_3c8 + 1),puVar9);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_3c0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_3d0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_3c0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_20.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11b,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_20.message_,&local_3d0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_20.message_);
                                      testing::Message::~Message(&local_3d0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_3c0);
                                    local_3ec = 0;
                                    pMVar10 = proto2_unittest::TestMap::map_uint64_uint64
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_3f8 = 0;
                                    puVar11 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                        (pMVar10,&local_3f8);
                                    testing::internal::EqHelper::
                                    Compare<int,_unsigned_long,_nullptr>
                                              ((EqHelper *)local_3e8,"0",
                                               "message.map_uint64_uint64().at(0)",&local_3ec,
                                               puVar11);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_3e8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_400);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_3e8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_21.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11c,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_21.message_,&local_400);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_21.message_);
                                      testing::Message::~Message(&local_400);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_3e8);
                                    local_41c = 0;
                                    pMVar4 = proto2_unittest::TestMap::map_sint32_sint32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_420 = 0;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_420);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_418,"0",
                                               "message.map_sint32_sint32().at(0)",&local_41c,piVar5
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_418);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_428);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_418);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_22.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11d,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_22.message_,&local_428);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_22.message_);
                                      testing::Message::~Message(&local_428);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_418);
                                    local_444 = 0;
                                    pMVar6 = proto2_unittest::TestMap::map_sint64_sint64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_450 = 0;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_450);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_440,"0",
                                               "message.map_sint64_sint64().at(0)",&local_444,plVar7
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_440);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_458);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_440);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_23.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11e,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_23.message_,&local_458);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_23.message_);
                                      testing::Message::~Message(&local_458);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_440);
                                    local_478[1] = 0;
                                    pMVar8 = proto2_unittest::TestMap::map_fixed32_fixed32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_478[0] = 0;
                                    puVar9 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (pMVar8,local_478);
                                    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                              ((EqHelper *)local_470,"0",
                                               "message.map_fixed32_fixed32().at(0)",
                                               (int *)(local_478 + 1),puVar9);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_470);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_480);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_470);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_24.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11f,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_24.message_,&local_480);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_24.message_);
                                      testing::Message::~Message(&local_480);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_470);
                                    local_49c = 0;
                                    pMVar10 = proto2_unittest::TestMap::map_fixed64_fixed64
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_4a8 = 0;
                                    puVar11 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                        (pMVar10,&local_4a8);
                                    testing::internal::EqHelper::
                                    Compare<int,_unsigned_long,_nullptr>
                                              ((EqHelper *)local_498,"0",
                                               "message.map_fixed64_fixed64().at(0)",&local_49c,
                                               puVar11);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_498);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4b0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_498);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_25.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x120,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_25.message_,&local_4b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_25.message_);
                                      testing::Message::~Message(&local_4b0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_498);
                                    local_4cc = 0;
                                    pMVar4 = proto2_unittest::TestMap::map_sfixed32_sfixed32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_4d0 = 0;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_4d0);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_4c8,"0",
                                               "message.map_sfixed32_sfixed32().at(0)",&local_4cc,
                                               piVar5);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4c8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4d8);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4c8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_26.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x121,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_26.message_,&local_4d8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_26.message_);
                                      testing::Message::~Message(&local_4d8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4c8);
                                    local_4f4 = 0;
                                    pMVar6 = proto2_unittest::TestMap::map_sfixed64_sfixed64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_500 = 0;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_500);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_4f0,"0",
                                               "message.map_sfixed64_sfixed64().at(0)",&local_4f4,
                                               plVar7);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4f0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_508);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4f0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_27.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x122,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_27.message_,&local_508);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_27.message_);
                                      testing::Message::~Message(&local_508);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4f0);
                                    local_524 = 0;
                                    pMVar12 = proto2_unittest::TestMap::map_int32_float
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_528 = 0;
                                    pfVar13 = Map<int,_float>::at<int>(pMVar12,&local_528);
                                    testing::internal::EqHelper::Compare<int,_float,_nullptr>
                                              ((EqHelper *)local_520,"0",
                                               "message.map_int32_float().at(0)",&local_524,pfVar13)
                                    ;
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_520);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_530);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_520);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_28.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x123,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_28.message_,&local_530);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_28.message_);
                                      testing::Message::~Message(&local_530);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_520);
                                    local_54c = 0;
                                    pMVar14 = proto2_unittest::TestMap::map_int32_double
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_550 = 0;
                                    pdVar15 = Map<int,_double>::at<int>(pMVar14,&local_550);
                                    testing::internal::EqHelper::Compare<int,_double,_nullptr>
                                              ((EqHelper *)local_548,"0",
                                               "message.map_int32_double().at(0)",&local_54c,pdVar15
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_548);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_558);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_548);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_29.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x124,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_29.message_,&local_558);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_29.message_);
                                      testing::Message::~Message(&local_558);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_548);
                                    local_571 = false;
                                    pMVar16 = proto2_unittest::TestMap::map_bool_bool
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_572 = false;
                                    pbVar17 = Map<bool,_bool>::at<bool>(pMVar16,&local_572);
                                    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                                              ((EqHelper *)local_570,"false",
                                               "message.map_bool_bool().at(0)",&local_571,pbVar17);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_570);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_580);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_570);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x125,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30.message_,&local_580);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30.message_);
                                      testing::Message::~Message(&local_580);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_570);
                                    long_string_abi_cxx11_();
                                    pMVar18 = (Map<std::__cxx11::string,std::__cxx11::string> *)
                                              proto2_unittest::TestMap::map_string_string_abi_cxx11_
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    long_string_abi_cxx11_();
                                    pbVar19 = Map<std::__cxx11::string,std::__cxx11::string>::
                                              at<std::__cxx11::string>(pMVar18,&local_5d8);
                                    testing::internal::EqHelper::
                                    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                              ((EqHelper *)local_598,"long_string()",
                                               "message.map_string_string().at(long_string())",
                                               &local_5b8,pbVar19);
                                    std::__cxx11::string::~string((string *)&local_5d8);
                                    std::__cxx11::string::~string((string *)&local_5b8);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_598);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_5e0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_598);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_31.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x126,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_31.message_,&local_5e0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_31.message_);
                                      testing::Message::~Message(&local_5e0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_598);
                                    long_string_abi_cxx11_();
                                    pMVar20 = proto2_unittest::TestMap::map_int32_bytes_abi_cxx11_
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_61c = 0;
                                    pbVar19 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::at<int>(pMVar20,&local_61c);
                                    testing::internal::EqHelper::
                                    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                              ((EqHelper *)local_5f8,"long_string()",
                                               "message.map_int32_bytes().at(0)",&local_618,pbVar19)
                                    ;
                                    std::__cxx11::string::~string((string *)&local_618);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_5f8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_628);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_5f8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_32.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x127,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_32.message_,&local_628);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_32.message_);
                                      testing::Message::~Message(&local_628);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_5f8);
                                    local_644 = MapEnum_BAR<proto2_unittest::TestMap>();
                                    pMVar21 = proto2_unittest::TestMap::map_int32_enum
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_648 = 0;
                                    pMVar22 = Map<int,_proto2_unittest::MapEnum>::at<int>
                                                        (pMVar21,&local_648);
                                    testing::internal::EqHelper::
                                    Compare<proto2_unittest::MapEnum,_proto2_unittest::MapEnum,_nullptr>
                                              ((EqHelper *)local_640,"MapEnum_BAR<TestMap>()",
                                               "message.map_int32_enum().at(0)",&local_644,pMVar22);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_640);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_650);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_640);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_33.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x128,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_33.message_,&local_650);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_33.message_);
                                      testing::Message::~Message(&local_650);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_640);
                                    local_670[1] = 0;
                                    pMVar23 = proto2_unittest::TestMap::map_int32_foreign_message
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_674 = 0;
                                    pkVar25 = &local_674;
                                    pFVar24 = Map<int,_proto2_unittest::ForeignMessage>::at<int>
                                                        (pMVar23,pkVar25);
                                    local_670[0] = proto2_unittest::ForeignMessage::c
                                                             (pFVar24,pkVar25,extraout_RDX);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_668,"0",
                                               "message.map_int32_foreign_message().at(0).c()",
                                               local_670 + 1,local_670);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_668);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_680);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_668);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_34.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x129,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_34.message_,&local_680);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_34.message_);
                                      testing::Message::~Message(&local_680);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_668);
                                    local_69c = 1;
                                    pMVar4 = proto2_unittest::TestMap::map_int32_int32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_6a0 = 1;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_6a0);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_698,"1",
                                               "message.map_int32_int32().at(1)",&local_69c,piVar5);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_698);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_6a8);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_698);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_35.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,299,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_35.message_,&local_6a8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_35.message_);
                                      testing::Message::~Message(&local_6a8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_698);
                                    local_6c4 = 1;
                                    pMVar6 = proto2_unittest::TestMap::map_int64_int64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_6d0 = 1;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_6d0);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_6c0,"1",
                                               "message.map_int64_int64().at(1)",&local_6c4,plVar7);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_6c0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_6d8);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_6c0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_36.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,300,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_36.message_,&local_6d8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_36.message_);
                                      testing::Message::~Message(&local_6d8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_6c0);
                                    local_6f8[1] = 1;
                                    pMVar8 = proto2_unittest::TestMap::map_uint32_uint32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_6f8[0] = 1;
                                    puVar9 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (pMVar8,local_6f8);
                                    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                              ((EqHelper *)local_6f0,"1",
                                               "message.map_uint32_uint32().at(1)",
                                               (int *)(local_6f8 + 1),puVar9);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_6f0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_700);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_6f0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_37.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12d,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_37.message_,&local_700);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_37.message_);
                                      testing::Message::~Message(&local_700);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_6f0);
                                    local_71c = 1;
                                    pMVar10 = proto2_unittest::TestMap::map_uint64_uint64
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_728 = 1;
                                    puVar11 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                        (pMVar10,&local_728);
                                    testing::internal::EqHelper::
                                    Compare<int,_unsigned_long,_nullptr>
                                              ((EqHelper *)local_718,"1",
                                               "message.map_uint64_uint64().at(1)",&local_71c,
                                               puVar11);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_718);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_730);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_718);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_38.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12e,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_38.message_,&local_730);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_38.message_);
                                      testing::Message::~Message(&local_730);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_718);
                                    local_74c = 1;
                                    pMVar4 = proto2_unittest::TestMap::map_sint32_sint32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_750 = 1;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_750);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_748,"1",
                                               "message.map_sint32_sint32().at(1)",&local_74c,piVar5
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_748);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_758);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_748);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_39.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12f,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_39.message_,&local_758);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_39.message_);
                                      testing::Message::~Message(&local_758);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_748);
                                    local_774 = 1;
                                    pMVar6 = proto2_unittest::TestMap::map_sint64_sint64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_780 = 1;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_780);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_770,"1",
                                               "message.map_sint64_sint64().at(1)",&local_774,plVar7
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_770);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_788);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_770);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_40.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x130,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_40.message_,&local_788);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_40.message_);
                                      testing::Message::~Message(&local_788);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_770);
                                    local_7a8[1] = 1;
                                    pMVar8 = proto2_unittest::TestMap::map_fixed32_fixed32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_7a8[0] = 1;
                                    puVar9 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (pMVar8,local_7a8);
                                    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                              ((EqHelper *)local_7a0,"1",
                                               "message.map_fixed32_fixed32().at(1)",
                                               (int *)(local_7a8 + 1),puVar9);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_7a0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_7b0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_7a0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_41.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x131,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_41.message_,&local_7b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_41.message_);
                                      testing::Message::~Message(&local_7b0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_7a0);
                                    local_7cc = 1;
                                    pMVar10 = proto2_unittest::TestMap::map_fixed64_fixed64
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_7d8 = 1;
                                    puVar11 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                        (pMVar10,&local_7d8);
                                    testing::internal::EqHelper::
                                    Compare<int,_unsigned_long,_nullptr>
                                              ((EqHelper *)local_7c8,"1",
                                               "message.map_fixed64_fixed64().at(1)",&local_7cc,
                                               puVar11);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_7c8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_7e0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_7c8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_42.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x132,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_42.message_,&local_7e0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_42.message_);
                                      testing::Message::~Message(&local_7e0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_7c8);
                                    local_7fc = 1;
                                    pMVar4 = proto2_unittest::TestMap::map_sfixed32_sfixed32
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_800 = 1;
                                    piVar5 = Map<int,_int>::at<int>(pMVar4,&local_800);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_7f8,"1",
                                               "message.map_sfixed32_sfixed32().at(1)",&local_7fc,
                                               piVar5);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_7f8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_808);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_7f8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x133,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_43.message_,&local_808);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_);
                                      testing::Message::~Message(&local_808);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_7f8);
                                    local_824 = 1;
                                    pMVar6 = proto2_unittest::TestMap::map_sfixed64_sfixed64
                                                       ((TestMap *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_830 = 1;
                                    plVar7 = Map<long,_long>::at<long>(pMVar6,&local_830);
                                    testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                              ((EqHelper *)local_820,"1",
                                               "message.map_sfixed64_sfixed64().at(1)",&local_824,
                                               plVar7);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_820);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_838);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_820);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_44.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x134,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_44.message_,&local_838);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_44.message_);
                                      testing::Message::~Message(&local_838);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_820);
                                    local_854 = 1;
                                    pMVar12 = proto2_unittest::TestMap::map_int32_float
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_858 = 1;
                                    pfVar13 = Map<int,_float>::at<int>(pMVar12,&local_858);
                                    testing::internal::EqHelper::Compare<int,_float,_nullptr>
                                              ((EqHelper *)local_850,"1",
                                               "message.map_int32_float().at(1)",&local_854,pfVar13)
                                    ;
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_850);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_860);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_850);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_45.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x135,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_45.message_,&local_860);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_45.message_);
                                      testing::Message::~Message(&local_860);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_850);
                                    local_87c = 1;
                                    pMVar14 = proto2_unittest::TestMap::map_int32_double
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_880 = 1;
                                    pdVar15 = Map<int,_double>::at<int>(pMVar14,&local_880);
                                    testing::internal::EqHelper::Compare<int,_double,_nullptr>
                                              ((EqHelper *)local_878,"1",
                                               "message.map_int32_double().at(1)",&local_87c,pdVar15
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_878);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_888);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_878);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_46.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x136,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_46.message_,&local_888);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_46.message_);
                                      testing::Message::~Message(&local_888);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_878);
                                    local_8a1 = true;
                                    pMVar16 = proto2_unittest::TestMap::map_bool_bool
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_8a2 = true;
                                    pbVar17 = Map<bool,_bool>::at<bool>(pMVar16,&local_8a2);
                                    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                                              ((EqHelper *)local_8a0,"true",
                                               "message.map_bool_bool().at(1)",&local_8a1,pbVar17);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_8a0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_8b0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_8a0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_47.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x137,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_47.message_,&local_8b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_47.message_);
                                      testing::Message::~Message(&local_8b0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_8a0);
                                    long_string_2_abi_cxx11_();
                                    pMVar18 = (Map<std::__cxx11::string,std::__cxx11::string> *)
                                              proto2_unittest::TestMap::map_string_string_abi_cxx11_
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    long_string_2_abi_cxx11_();
                                    pbVar19 = Map<std::__cxx11::string,std::__cxx11::string>::
                                              at<std::__cxx11::string>(pMVar18,&local_908);
                                    testing::internal::EqHelper::
                                    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                              ((EqHelper *)local_8c8,"long_string_2()",
                                               "message.map_string_string().at(long_string_2())",
                                               &local_8e8,pbVar19);
                                    std::__cxx11::string::~string((string *)&local_908);
                                    std::__cxx11::string::~string((string *)&local_8e8);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_8c8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_910);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_8c8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_48.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x138,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_48.message_,&local_910);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_48.message_);
                                      testing::Message::~Message(&local_910);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_8c8);
                                    long_string_2_abi_cxx11_();
                                    pMVar20 = proto2_unittest::TestMap::map_int32_bytes_abi_cxx11_
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_94c = 1;
                                    pbVar19 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::at<int>(pMVar20,&local_94c);
                                    testing::internal::EqHelper::
                                    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                              ((EqHelper *)local_928,"long_string_2()",
                                               "message.map_int32_bytes().at(1)",&local_948,pbVar19)
                                    ;
                                    std::__cxx11::string::~string((string *)&local_948);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_928);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_958);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_928);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_49.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x139,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_49.message_,&local_958);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_49.message_);
                                      testing::Message::~Message(&local_958);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_928);
                                    local_974 = MapEnum_BAZ<proto2_unittest::TestMap>();
                                    pMVar21 = proto2_unittest::TestMap::map_int32_enum
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_978 = 1;
                                    pMVar22 = Map<int,_proto2_unittest::MapEnum>::at<int>
                                                        (pMVar21,&local_978);
                                    testing::internal::EqHelper::
                                    Compare<proto2_unittest::MapEnum,_proto2_unittest::MapEnum,_nullptr>
                                              ((EqHelper *)local_970,"MapEnum_BAZ<TestMap>()",
                                               "message.map_int32_enum().at(1)",&local_974,pMVar22);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_970);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_980);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_970);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_50.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13a,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_50.message_,&local_980);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_50.message_);
                                      testing::Message::~Message(&local_980);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_970);
                                    local_9a0[1] = 1;
                                    pMVar23 = proto2_unittest::TestMap::map_int32_foreign_message
                                                        ((TestMap *)
                                                         gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    local_9a4 = 1;
                                    pkVar25 = &local_9a4;
                                    pFVar24 = Map<int,_proto2_unittest::ForeignMessage>::at<int>
                                                        (pMVar23,pkVar25);
                                    local_9a0[0] = proto2_unittest::ForeignMessage::c
                                                             (pFVar24,pkVar25,extraout_RDX_00);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_998,"1",
                                               "message.map_int32_foreign_message().at(1).c()",
                                               local_9a0 + 1,local_9a0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_998);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_9b0);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_998);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_9b8,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13b,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                (&local_9b8,&local_9b0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_9b8);
                                      testing::Message::~Message(&local_9b0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_998);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MapTestUtil::ExpectMapFieldsSet(const TestMap& message) {
  ASSERT_EQ(2, message.map_int32_int32().size());
  ASSERT_EQ(2, message.map_int64_int64().size());
  ASSERT_EQ(2, message.map_uint32_uint32().size());
  ASSERT_EQ(2, message.map_uint64_uint64().size());
  ASSERT_EQ(2, message.map_sint32_sint32().size());
  ASSERT_EQ(2, message.map_sint64_sint64().size());
  ASSERT_EQ(2, message.map_fixed32_fixed32().size());
  ASSERT_EQ(2, message.map_fixed64_fixed64().size());
  ASSERT_EQ(2, message.map_sfixed32_sfixed32().size());
  ASSERT_EQ(2, message.map_sfixed64_sfixed64().size());
  ASSERT_EQ(2, message.map_int32_float().size());
  ASSERT_EQ(2, message.map_int32_double().size());
  ASSERT_EQ(2, message.map_bool_bool().size());
  ASSERT_EQ(2, message.map_string_string().size());
  ASSERT_EQ(2, message.map_int32_bytes().size());
  ASSERT_EQ(2, message.map_int32_enum().size());
  ASSERT_EQ(2, message.map_int32_foreign_message().size());

  EXPECT_EQ(0, message.map_int32_int32().at(0));
  EXPECT_EQ(0, message.map_int64_int64().at(0));
  EXPECT_EQ(0, message.map_uint32_uint32().at(0));
  EXPECT_EQ(0, message.map_uint64_uint64().at(0));
  EXPECT_EQ(0, message.map_sint32_sint32().at(0));
  EXPECT_EQ(0, message.map_sint64_sint64().at(0));
  EXPECT_EQ(0, message.map_fixed32_fixed32().at(0));
  EXPECT_EQ(0, message.map_fixed64_fixed64().at(0));
  EXPECT_EQ(0, message.map_sfixed32_sfixed32().at(0));
  EXPECT_EQ(0, message.map_sfixed64_sfixed64().at(0));
  EXPECT_EQ(0, message.map_int32_float().at(0));
  EXPECT_EQ(0, message.map_int32_double().at(0));
  EXPECT_EQ(false, message.map_bool_bool().at(0));
  EXPECT_EQ(long_string(), message.map_string_string().at(long_string()));
  EXPECT_EQ(long_string(), message.map_int32_bytes().at(0));
  EXPECT_EQ(MapEnum_BAR<TestMap>(), message.map_int32_enum().at(0));
  EXPECT_EQ(0, message.map_int32_foreign_message().at(0).c());

  EXPECT_EQ(1, message.map_int32_int32().at(1));
  EXPECT_EQ(1, message.map_int64_int64().at(1));
  EXPECT_EQ(1, message.map_uint32_uint32().at(1));
  EXPECT_EQ(1, message.map_uint64_uint64().at(1));
  EXPECT_EQ(1, message.map_sint32_sint32().at(1));
  EXPECT_EQ(1, message.map_sint64_sint64().at(1));
  EXPECT_EQ(1, message.map_fixed32_fixed32().at(1));
  EXPECT_EQ(1, message.map_fixed64_fixed64().at(1));
  EXPECT_EQ(1, message.map_sfixed32_sfixed32().at(1));
  EXPECT_EQ(1, message.map_sfixed64_sfixed64().at(1));
  EXPECT_EQ(1, message.map_int32_float().at(1));
  EXPECT_EQ(1, message.map_int32_double().at(1));
  EXPECT_EQ(true, message.map_bool_bool().at(1));
  EXPECT_EQ(long_string_2(), message.map_string_string().at(long_string_2()));
  EXPECT_EQ(long_string_2(), message.map_int32_bytes().at(1));
  EXPECT_EQ(MapEnum_BAZ<TestMap>(), message.map_int32_enum().at(1));
  EXPECT_EQ(1, message.map_int32_foreign_message().at(1).c());
}